

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void __thiscall
icu_63::VTimeZone::beginRRULE(VTimeZone *this,VTZWriter *writer,int32_t month,UErrorCode *status)

{
  UBool UVar1;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  undefined1 local_68 [8];
  UnicodeString dstr;
  UErrorCode *status_local;
  int32_t month_local;
  VTZWriter *writer_local;
  VTimeZone *this_local;
  
  dstr.fUnion._48_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UnicodeString::UnicodeString((UnicodeString *)local_68);
    VTZWriter::write(writer,0x425122,__buf,(size_t)status);
    VTZWriter::write(writer,0x3a,__buf_00,(size_t)status);
    VTZWriter::write(writer,0x425230,__buf_01,(size_t)status);
    VTZWriter::write(writer,0x3d,__buf_02,(size_t)status);
    VTZWriter::write(writer,0x42523a,__buf_03,(size_t)status);
    VTZWriter::write(writer,0x3b,__buf_04,(size_t)status);
    VTZWriter::write(writer,0x425250,__buf_05,(size_t)status);
    VTZWriter::write(writer,0x3d,__buf_06,(size_t)status);
    appendAsciiDigits(month + 1,'\0',(UnicodeString *)local_68);
    VTZWriter::write(writer,(int)local_68,__buf_07,(size_t)status);
    VTZWriter::write(writer,0x3b,__buf_08,(size_t)status);
    UnicodeString::~UnicodeString((UnicodeString *)local_68);
  }
  return;
}

Assistant:

void
VTimeZone::beginRRULE(VTZWriter& writer, int32_t month, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    UnicodeString dstr;
    writer.write(ICAL_RRULE);
    writer.write(COLON);
    writer.write(ICAL_FREQ);
    writer.write(EQUALS_SIGN);
    writer.write(ICAL_YEARLY);
    writer.write(SEMICOLON);
    writer.write(ICAL_BYMONTH);
    writer.write(EQUALS_SIGN);
    appendAsciiDigits(month + 1, 0, dstr);
    writer.write(dstr);
    writer.write(SEMICOLON);
}